

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O2

void __thiscall
ON_OBSOLETE_V5_Annotation::SetType(ON_OBSOLETE_V5_Annotation *this,V5_eAnnotationType type)

{
  int iVar1;
  undefined7 in_register_00000031;
  wchar_t *s;
  
  this->m_type = type;
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 == 4) {
    s = ON_OBSOLETE_V5_DimRadial::DefaultDiameterText::defstr;
  }
  else if (iVar1 == 5) {
    s = ON_OBSOLETE_V5_DimRadial::DefaultRadiusText::defstr;
  }
  else {
    s = (wchar_t *)0x0;
  }
  ON_OBSOLETE_V5_AnnotationText::SetText(&this->m_usertext,s);
  ON_AnnotationTextFormula::Set(this,(wchar_t *)0x0);
  return;
}

Assistant:

void ON_OBSOLETE_V5_Annotation::SetType( ON_INTERNAL_OBSOLETE::V5_eAnnotationType type ) 
{ 
  m_type = type;
  if(type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimRadius)
    SetTextValue(ON_OBSOLETE_V5_DimRadial::DefaultRadiusText());
  else if(type == ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimDiameter)
    SetTextValue(ON_OBSOLETE_V5_DimRadial::DefaultDiameterText());
  else
    SetTextValue(0);

  SetTextFormula(0);
}